

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire_latest(Curl_easy *data,time_t milli)

{
  timeval *ptVar1;
  time_t tVar2;
  timeval tVar3;
  time_t diff;
  long local_38;
  __time_t local_30;
  timeval set;
  timeval *expire;
  time_t milli_local;
  Curl_easy *data_local;
  
  ptVar1 = &(data->state).expiretime;
  tVar3 = curlx_tvnow();
  diff = tVar3.tv_sec;
  local_38 = tVar3.tv_usec;
  local_30 = milli / 1000 + diff;
  set.tv_sec = (milli % 1000) * 1000 + local_38;
  if (999999 < set.tv_sec) {
    local_30 = local_30 + 1;
    set.tv_sec = set.tv_sec + -1000000;
  }
  if (((ptVar1->tv_sec == 0) && ((data->state).expiretime.tv_usec == 0)) ||
     (tVar3.tv_usec = set.tv_sec, tVar3.tv_sec = local_30, tVar2 = curlx_tvdiff(tVar3,*ptVar1),
     tVar2 < 1)) {
    Curl_expire(data,milli);
  }
  return;
}

Assistant:

void Curl_expire_latest(struct Curl_easy *data, time_t milli)
{
  struct timeval *expire = &data->state.expiretime;

  struct timeval set;

  set = Curl_tvnow();
  set.tv_sec += (long)(milli / 1000);
  set.tv_usec += (milli % 1000) * 1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  if(expire->tv_sec || expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
         is. */
    time_t diff = curlx_tvdiff(set, *expire);
    if(diff > 0)
      /* the new expire time was later than the top time, so just skip this */
      return;
  }

  /* Just add the timeout like normal */
  Curl_expire(data, milli);
}